

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

optional<int>
wallet::ReadPragmaInteger(sqlite3 *db,string *key,string *description,bilingual_str *error)

{
  long lVar1;
  string original;
  string original_00;
  int iVar2;
  uint uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this;
  char **args_1;
  ulong uVar4;
  long in_FS_OFFSET;
  undefined8 uStack_e8;
  _Alloc_hider local_e0;
  sqlite3_stmt *pragma_read_stmt;
  undefined8 local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  bilingual_str local_90;
  string stmt_text;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tinyformat::format<std::__cxx11::string>
            (&stmt_text,(tinyformat *)"PRAGMA %s",(char *)key,&error->original);
  pragma_read_stmt = (sqlite3_stmt *)0x0;
  args_1 = (char **)0x0;
  iVar2 = sqlite3_prepare_v2(db,stmt_text._M_dataplus._M_p,0xffffffffffffffff);
  if (iVar2 == 0) {
    iVar2 = sqlite3_step(pragma_read_stmt);
    if (iVar2 == 100) {
      uVar3 = sqlite3_column_int(pragma_read_stmt,0);
      error = (bilingual_str *)(ulong)uVar3;
      sqlite3_finalize(pragma_read_stmt);
      uVar4 = 0x100000000;
      goto LAB_001ad0ed;
    }
    sqlite3_finalize(pragma_read_stmt);
    local_e0._M_p = (pointer)sqlite3_errstr(iVar2);
    tinyformat::format<std::__cxx11::string,char_const*>
              ((string *)&stack0xffffffffffffff30,
               (tinyformat *)"SQLiteDatabase: Failed to fetch %s: %s",(char *)description,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff20,args_1);
    original_00._M_string_length = (size_type)local_e0._M_p;
    original_00._M_dataplus._M_p = (pointer)uStack_e8;
    original_00.field_2._M_allocated_capacity = (size_type)pragma_read_stmt;
    original_00.field_2._8_8_ = local_d0;
    Untranslated(&local_90,original_00);
    bilingual_str::operator=(error,&local_90);
    bilingual_str::~bilingual_str(&local_90);
    this = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&stack0xffffffffffffff30;
  }
  else {
    sqlite3_finalize();
    local_e0._M_p = (pointer)sqlite3_errstr(iVar2);
    tinyformat::format<std::__cxx11::string,char_const*>
              ((string *)local_b0,
               (tinyformat *)"SQLiteDatabase: Failed to prepare the statement to fetch %s: %s",
               (char *)description,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff20,args_1);
    original._M_string_length = (size_type)local_e0._M_p;
    original._M_dataplus._M_p = (pointer)uStack_e8;
    original.field_2._M_allocated_capacity = (size_type)pragma_read_stmt;
    original.field_2._8_8_ = local_d0;
    Untranslated(&local_90,original);
    bilingual_str::operator=(error,&local_90);
    bilingual_str::~bilingual_str(&local_90);
    this = local_b0;
  }
  std::__cxx11::string::~string((string *)this->_M_local_buf);
  uVar4 = 0;
LAB_001ad0ed:
  std::__cxx11::string::~string((string *)&stmt_text);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<int,_true,_true>)
           (_Optional_base<int,_true,_true>)(uVar4 | (ulong)error & 0xffffffff);
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<int> ReadPragmaInteger(sqlite3* db, const std::string& key, const std::string& description, bilingual_str& error)
{
    std::string stmt_text = strprintf("PRAGMA %s", key);
    sqlite3_stmt* pragma_read_stmt{nullptr};
    int ret = sqlite3_prepare_v2(db, stmt_text.c_str(), -1, &pragma_read_stmt, nullptr);
    if (ret != SQLITE_OK) {
        sqlite3_finalize(pragma_read_stmt);
        error = Untranslated(strprintf("SQLiteDatabase: Failed to prepare the statement to fetch %s: %s", description, sqlite3_errstr(ret)));
        return std::nullopt;
    }
    ret = sqlite3_step(pragma_read_stmt);
    if (ret != SQLITE_ROW) {
        sqlite3_finalize(pragma_read_stmt);
        error = Untranslated(strprintf("SQLiteDatabase: Failed to fetch %s: %s", description, sqlite3_errstr(ret)));
        return std::nullopt;
    }
    int result = sqlite3_column_int(pragma_read_stmt, 0);
    sqlite3_finalize(pragma_read_stmt);
    return result;
}